

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_object.cpp
# Opt level: O3

void __thiscall
duckdb::AggregateFilterData::AggregateFilterData
          (AggregateFilterData *this,ClientContext *context,Expression *filter_expr,
          vector<duckdb::LogicalType,_true> *payload_types)

{
  Allocator *allocator;
  
  ExpressionExecutor::ExpressionExecutor(&this->filter_executor,context,filter_expr);
  DataChunk::DataChunk(&this->filtered_payload);
  SelectionVector::SelectionVector(&this->true_sel,0x800);
  if ((payload_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (payload_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    allocator = Allocator::Get(context);
    DataChunk::Initialize(&this->filtered_payload,allocator,payload_types,0x800);
  }
  return;
}

Assistant:

AggregateFilterData::AggregateFilterData(ClientContext &context, Expression &filter_expr,
                                         const vector<LogicalType> &payload_types)
    : filter_executor(context, &filter_expr), true_sel(STANDARD_VECTOR_SIZE) {
	if (payload_types.empty()) {
		return;
	}
	filtered_payload.Initialize(Allocator::Get(context), payload_types);
}